

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O3

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Order
          (Relation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expressions)

{
  string *psVar1;
  ParserOptions options_00;
  Relation *pRVar2;
  ClientContext *pCVar3;
  DatabaseInstance *pDVar4;
  reference __args;
  ParserException *pPVar5;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *select_list;
  shared_ptr<duckdb::Relation,_true> sVar6;
  vector<duckdb::OrderByNode,_true> order_list;
  ParserOptions options;
  vector<duckdb::OrderByNode,_true> inner_list;
  undefined1 local_c8 [32];
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_a8;
  vector<duckdb::OrderByNode,_true> *local_88;
  Relation *local_80;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined6 uStack_76;
  idx_t iStack_70;
  vector<duckdb::ParserExtension,_true> *local_68;
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_60;
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_48;
  
  select_list = (string *)*in_RDX;
  psVar1 = (string *)in_RDX[1];
  local_80 = this;
  if (select_list == psVar1) {
    pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
    local_c8._0_8_ = local_c8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"Zero ORDER BY expressions provided","");
    ParserException::ParserException(pPVar5,(string *)local_c8);
    __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_a8.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = (vector<duckdb::OrderByNode,_true> *)expressions;
  while( true ) {
    shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
              ((shared_ptr<duckdb::ClientContextWrapper,_true> *)(expressions + 1));
    ClientContextWrapper::GetContext((ClientContextWrapper *)local_c8);
    pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator->
                       ((shared_ptr<duckdb::ClientContext,_true> *)local_c8);
    local_78 = (pCVar3->config).preserve_identifier_case;
    uStack_77 = (pCVar3->config).integer_division;
    iStack_70 = (pCVar3->config).max_expression_depth;
    pDVar4 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&pCVar3->db);
    local_68 = &(pDVar4->config).parser_extensions;
    options_00.integer_division = (bool)uStack_77;
    options_00.preserve_identifier_case = (bool)local_78;
    options_00._2_6_ = uStack_76;
    options_00.max_expression_depth = iStack_70;
    options_00.extensions = local_68;
    Parser::ParseOrderList((vector<duckdb::OrderByNode,_true> *)&local_60,select_list,options_00);
    if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    if ((long)local_60.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_60.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10) break;
    __args = vector<duckdb::OrderByNode,_true>::operator[]
                       ((vector<duckdb::OrderByNode,_true> *)&local_60,0);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::
    emplace_back<duckdb::OrderByNode>(&local_a8,__args);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_60);
    pRVar2 = local_80;
    select_list = select_list + 1;
    if (select_list == psVar1) {
      local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_start =
           local_a8.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           local_a8.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Order(local_80,local_88);
      ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_48);
      ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_a8);
      sVar6.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar6.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pRVar2;
      return (shared_ptr<duckdb::Relation,_true>)
             sVar6.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
  local_c8._0_8_ = local_c8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"Expected a single ORDER BY expression in the expression list","");
  ParserException::ParserException(pPVar5,(string *)local_c8);
  __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Relation::Order(const vector<string> &expressions) {
	if (expressions.empty()) {
		throw ParserException("Zero ORDER BY expressions provided");
	}
	vector<OrderByNode> order_list;
	for (auto &expression : expressions) {
		auto inner_list = Parser::ParseOrderList(expression, context->GetContext()->GetParserOptions());
		if (inner_list.size() != 1) {
			throw ParserException("Expected a single ORDER BY expression in the expression list");
		}
		order_list.push_back(std::move(inner_list[0]));
	}
	return Order(std::move(order_list));
}